

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Promise<void> __thiscall kj::HttpServer::listenLoop(HttpServer *this,ConnectionReceiver *port)

{
  PromiseNode *pPVar1;
  TransformPromiseNodeBase *this_00;
  Disposer *in_RDX;
  ChainPromiseNode *pCVar2;
  ChainPromiseNode *extraout_RDX;
  ChainPromiseNode *extraout_RDX_00;
  Own<kj::_::ChainPromiseNode> OVar3;
  Promise<void> PVar4;
  Own<kj::_::PromiseNode> local_50;
  Own<kj::_::PromiseNode> local_40;
  undefined4 local_30;
  undefined4 uStack_2c;
  undefined4 uStack_28;
  undefined4 uStack_24;
  
  (**in_RDX->_vptr_Disposer)(&local_50);
  this_00 = (TransformPromiseNodeBase *)operator_new(0x38);
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (this_00,&local_50,
             _::
             TransformPromiseNode<kj::Promise<void>,_kj::Own<kj::AsyncIoStream>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++:5066:13),_kj::_::PropagateException>
             ::anon_class_16_2_3fe4823c_for_func::operator());
  (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_00463a38;
  this_00[1].super_PromiseNode._vptr_PromiseNode = (_func_int **)port;
  this_00[1].dependency.disposer = in_RDX;
  local_40.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::Promise<void>,kj::Own<kj::AsyncIoStream>,kj::HttpServer::listenLoop(kj::ConnectionReceiver&)::$_0,kj::_::PropagateException>>
        ::instance;
  local_40.ptr = (PromiseNode *)this_00;
  OVar3 = heap<kj::_::ChainPromiseNode,kj::Own<kj::_::PromiseNode>>((kj *)&local_30,&local_40);
  pPVar1 = local_40.ptr;
  pCVar2 = OVar3.ptr;
  *(undefined4 *)&(this->super_ErrorHandler)._vptr_ErrorHandler = local_30;
  *(undefined4 *)((long)&(this->super_ErrorHandler)._vptr_ErrorHandler + 4) = uStack_2c;
  *(undefined4 *)&this->timer = uStack_28;
  *(undefined4 *)((long)&this->timer + 4) = uStack_24;
  if ((TransformPromiseNodeBase *)local_40.ptr != (TransformPromiseNodeBase *)0x0) {
    local_40.ptr = (PromiseNode *)0x0;
    (**(local_40.disposer)->_vptr_Disposer)
              (local_40.disposer,
               ((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode[-2] +
               (long)&((PromiseNode *)&pPVar1->_vptr_PromiseNode)->_vptr_PromiseNode);
    pCVar2 = extraout_RDX;
  }
  pPVar1 = local_50.ptr;
  if (local_50.ptr != (PromiseNode *)0x0) {
    local_50.ptr = (PromiseNode *)0x0;
    (**(local_50.disposer)->_vptr_Disposer)
              (local_50.disposer,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
    pCVar2 = extraout_RDX_00;
  }
  PVar4.super_PromiseBase.node.ptr = &pCVar2->super_PromiseNode;
  PVar4.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar4.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> HttpServer::listenLoop(kj::ConnectionReceiver& port) {
  return port.accept()
      .then([this,&port](kj::Own<kj::AsyncIoStream>&& connection) -> kj::Promise<void> {
    if (draining) {
      // Can get here if we *just* started draining.
      return kj::READY_NOW;
    }

    tasks.add(listenHttp(kj::mv(connection)));
    return listenLoop(port);
  });
}